

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O3

string * __thiscall
Assimp::B3DImporter::ReadChunk_abi_cxx11_(string *__return_storage_ptr__,B3DImporter *this)

{
  pointer *ppuVar1;
  iterator __position;
  uint uVar2;
  undefined8 in_RAX;
  int iVar3;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar3 = 4;
  uStack_28 = in_RAX;
  do {
    ReadByte(this);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  iVar3 = ReadInt(this);
  uVar2 = iVar3 + this->_pos;
  uStack_28 = CONCAT44(uVar2,(undefined4)uStack_28);
  __position._M_current =
       (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->_stack,__position,(uint *)((long)&uStack_28 + 4));
  }
  else {
    *__position._M_current = uVar2;
    ppuVar1 = &(this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

string B3DImporter::ReadChunk(){
    string tag;
    for( int i=0;i<4;++i ){
        tag+=char( ReadByte() );
    }
#ifdef DEBUG_B3D
//	cout<<"ReadChunk:"<<tag<<endl;
#endif
    unsigned sz=(unsigned)ReadInt();
    _stack.push_back( _pos+sz );
    return tag;
}